

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O0

void test_iterators_on_empty_simplex_tree<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *tst)

{
  undefined8 uVar1;
  type_conflict3 tVar2;
  bool bVar3;
  ostream *poVar4;
  reference other;
  Filtration_simplex_range *this;
  reference other_00;
  lazy_ostream *plVar5;
  Filtration_value *pFVar6;
  void *pvVar7;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_278;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_250;
  assertion_result local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_1f8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  Filtration_simplex_range *__range1_2;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b0;
  assertion_result local_190;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_158;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  simplex;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0_1;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0_1;
  Complex_simplex_range *__range1_1;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b8;
  assertion_result local_98;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70;
  int local_5c;
  undefined1 local_58 [4];
  reference vertex;
  transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
  __end0;
  transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
  __begin0;
  Complex_vertex_range *__range1;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *tst_local;
  
  poVar4 = std::operator<<((ostream *)&std::clog,"Iterator on vertices: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::complex_vertex_range
            ((Complex_vertex_range *)&__begin0.field_0x8,tst);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  ::begin((transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
           *)&__end0.field_0x8,
          (iterator_range_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0.field_0x8);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  ::end((transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
         *)local_58,
        (iterator_range_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0.field_0x8);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                        *)&__end0.field_0x8,
                       (iterator_facade<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                        *)local_58);
    if (!tVar2) break;
    local_5c = boost::iterators::detail::
               iterator_facade_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
                            *)&__end0.field_0x8);
    poVar4 = std::operator<<((ostream *)&std::clog,"vertice:");
    pvVar7 = (void *)std::ostream::operator<<(poVar4,local_5c);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_80);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_70,0x3d,&local_80);
      boost::test_tools::assertion_result::assertion_result(&local_98,false);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_c8,"false",5)
      ;
      boost::unit_test::operator<<(&local_b8,plVar5,&local_c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&__range1_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::test_tools::tt_detail::report_assertion(&local_98,&local_b8,&__range1_1,0x3d,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_b8);
      boost::test_tools::assertion_result::~assertion_result(&local_98);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
                  *)&__end0.field_0x8);
  }
  poVar4 = std::operator<<((ostream *)&std::clog,"Iterator on simplices: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::complex_simplex_range
            ((Complex_simplex_range *)&__begin0_1.st_,tst);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *)&__end0_1.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0_1.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
         *)&simplex,
        (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0_1.st_);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0_1.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&simplex);
    if (!tVar2) break;
    other = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                         *)&__end0_1.st_);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_158,other);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_178);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_168,0x41,&local_178);
      bVar3 = boost::container::operator!=(&local_158,&local_158);
      boost::test_tools::assertion_result::assertion_result(&local_190,bVar3);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1c0,"simplex != simplex",0x12);
      boost::unit_test::operator<<(&local_1b0,plVar5,&local_1c0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&__range1_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::test_tools::tt_detail::report_assertion(&local_190,&local_1b0,&__range1_2,0x41,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_1b0);
      boost::test_tools::assertion_result::~assertion_result(&local_190);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                  *)&__end0_1.st_);
  }
  poVar4 = std::operator<<((ostream *)&std::clog,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  this = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration_simplex_range
                   (tst);
  __end0_2 = std::
             vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ::begin(this);
  f_simplex.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          ::end(this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end0_2,
                       (__normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
                        *)&f_simplex);
    if (!bVar3) break;
    other_00 = __gnu_cxx::
               __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
               ::operator*(&__end0_2);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_1f8,other_00);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_218);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_208,0x48,&local_218);
      boost::test_tools::assertion_result::assertion_result(&local_230,false);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_260,"false",5);
      boost::unit_test::operator<<(&local_250,plVar5,&local_260);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
                 ,0x76);
      boost::test_tools::tt_detail::report_assertion(&local_230,&local_250,&local_270,0x48,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_250);
      boost::test_tools::assertion_result::~assertion_result(&local_230);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    poVar4 = std::operator<<((ostream *)&std::clog,
                             "test_iterators_on_empty_simplex_tree - filtration=");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_278,&local_1f8);
    pFVar6 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                       (&local_278);
    pvVar7 = (void *)std::ostream::operator<<(poVar4,*pFVar6);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
    ::operator++(&__end0_2);
  }
  return;
}

Assistant:

void test_iterators_on_empty_simplex_tree(const typeST& tst) {
  std::clog << "Iterator on vertices: " << std::endl;
  for (auto vertex : tst.complex_vertex_range()) {
    std::clog << "vertice:" << vertex << std::endl;
    BOOST_CHECK(false); // shall be empty
  }
  std::clog << "Iterator on simplices: " << std::endl;
  for (auto simplex : tst.complex_simplex_range()) {
    BOOST_CHECK(simplex != simplex); // shall be empty - to remove warning of non-used simplex
  }

  std::clog
      << "Iterator on Simplices in the filtration, with [filtration value]:"
      << std::endl;
  for (auto f_simplex : tst.filtration_simplex_range()) {
    BOOST_CHECK(false); // shall be empty
    std::clog << "test_iterators_on_empty_simplex_tree - filtration="
        << tst.filtration(f_simplex) << std::endl;
  }
}